

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

void __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::Map
          (Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *this,
          Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *other)

{
  const_iterator first;
  const_iterator last;
  iterator_base<const_google::protobuf::MapPair<google::protobuf::MapKey,_google::protobuf::MapValueRef>_>
  local_28;
  
  (this->elements_).num_elements_ = 0;
  (this->elements_).num_buckets_ = 1;
  (this->elements_).seed_ = 0;
  (this->elements_).index_of_first_non_null_ = 1;
  (this->elements_).table_ = (void **)&internal::kGlobalEmptyTable;
  (this->elements_).alloc_.arena_ = (Arena *)0x0;
  InnerMap::
  iterator_base<const_google::protobuf::MapPair<google::protobuf::MapKey,_google::protobuf::MapValueRef>_>
  ::iterator_base(&local_28,&other->elements_);
  first.it_.m_ = local_28.m_;
  first.it_.node_ = local_28.node_;
  first.it_.bucket_index_ = local_28.bucket_index_;
  last.it_.bucket_index_ = 0;
  last.it_.node_ = (Node *)0x0;
  last.it_.m_ = (InnerMap *)0x0;
  Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::
  insert<google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::const_iterator>
            ((Map<google::protobuf::MapKey,google::protobuf::MapValueRef> *)this,first,last);
  return;
}

Assistant:

Map(const Map& other) : Map() { insert(other.begin(), other.end()); }